

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::createNodeTree(OpenGEXImporter *this,aiScene *pScene)

{
  _List_node_base *p_Var1;
  aiNode *paVar2;
  aiNode **ppaVar3;
  _List_node_base *p_Var4;
  
  p_Var1 = (_List_node_base *)this->m_root;
  if ((p_Var1 != (_List_node_base *)0x0) &&
     ((((list<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var1->_M_next)->
      super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.super__List_node_base.
      _M_next != p_Var1)) {
    pScene->mRootNode->mNumChildren = *(uint *)(p_Var1 + 1);
    paVar2 = pScene->mRootNode;
    ppaVar3 = (aiNode **)operator_new__((ulong)paVar2->mNumChildren << 3);
    paVar2->mChildren = ppaVar3;
    p_Var1 = (_List_node_base *)this->m_root;
    p_Var4 = p_Var1->_M_next;
    if (p_Var4 != p_Var1) {
      ppaVar3 = pScene->mRootNode->mChildren;
      do {
        *ppaVar3 = *(aiNode **)
                    &((list<aiNode_*,_std::allocator<aiNode_*>_> *)(p_Var4 + 1))->
                     super__List_base<aiNode_*,_std::allocator<aiNode_*>_>;
        ppaVar3 = ppaVar3 + 1;
        p_Var4 = (((list<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var4->_M_next)->
                 super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
      } while (p_Var4 != p_Var1);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::createNodeTree( aiScene *pScene ) {
    if( nullptr == m_root ) {
        return;
    }

    if( m_root->m_children.empty() ) {
        return;
    }

    pScene->mRootNode->mNumChildren = static_cast<unsigned int>(m_root->m_children.size());
    pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren ];
    std::copy( m_root->m_children.begin(), m_root->m_children.end(), pScene->mRootNode->mChildren );
}